

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::GlassMaterial::readFrom(GlassMaterial *this,BinaryReader *binary)

{
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->kr);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->kt);
  BinaryReader::read<float,void>(binary,&this->index);
  return;
}

Assistant:

void GlassMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(kr);
    binary.read(kt);
    binary.read(index);
  }